

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

bool __thiscall
cmCTestLaunch::Match
          (cmCTestLaunch *this,string *line,
          vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *regexps)

{
  RegularExpression *pRVar1;
  RegularExpression *pRVar2;
  bool bVar3;
  RegularExpression *this_00;
  RegularExpression *r;
  
  pRVar1 = (regexps->
           super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pRVar2 = (regexps->
           super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>).
           _M_impl.super__Vector_impl_data._M_start;
  do {
    this_00 = pRVar2;
    if (this_00 == pRVar1) break;
    bVar3 = cmsys::RegularExpression::find(this_00,line);
    pRVar2 = this_00 + 1;
  } while (!bVar3);
  return this_00 != pRVar1;
}

Assistant:

bool cmCTestLaunch::Match(std::string const& line,
                          std::vector<cmsys::RegularExpression>& regexps)
{
  for (cmsys::RegularExpression& r : regexps) {
    if (r.find(line)) {
      return true;
    }
  }
  return false;
}